

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Execute<double,long,duckdb::ArgMinMaxState<double,long>>
               (ArgMinMaxState<double,_long> *state,double x_data,long y_data,
               AggregateBinaryInput *binary)

{
  bool bVar1;
  long *in_RDX;
  TemplatedValidityMask<unsigned_long> *in_RSI;
  long in_RDI;
  ArgMinMaxState<double,_long> *in_XMM0_Qa;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_RSI,(idx_t)in_RDX);
  if ((bVar1) &&
     (bVar1 = GreaterThan::Operation<long>((long *)&stack0xffffffffffffffe8,(long *)(in_RDI + 0x10))
     , bVar1)) {
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_RSI,(idx_t)in_RDX);
    Assign<double,long,duckdb::ArgMinMaxState<double,long>>
              (in_XMM0_Qa,(double *)in_RSI,in_RDX,SUB81((ulong)in_RDI >> 0x38,0));
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}